

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O1

bool __thiscall
duckdb_shell::ShellState::SetOutputMode(ShellState *this,char *mode_str,char *tbl_name)

{
  char cVar1;
  int iVar2;
  size_t __n;
  char *pcVar3;
  char *pcVar4;
  string *psVar5;
  
  __n = strlen(mode_str);
  cVar1 = *mode_str;
  if ((__n < 3 || cVar1 != 'l') || (iVar2 = strncmp(mode_str,"lines",__n), iVar2 != 0)) {
    if ((cVar1 == 'c') && (iVar2 = strncmp(mode_str,"columns",__n), iVar2 == 0)) {
      this->mode = COLUMN;
      if ((this->shellFlgs & 0x80) == 0) {
        this->showHeader = true;
      }
      goto LAB_00216233;
    }
    if ((__n >= 3 && cVar1 == 'l') && (iVar2 = strncmp(mode_str,"list",__n), iVar2 == 0)) {
      this->mode = LIST;
      pcVar4 = (char *)(this->colSeparator)._M_string_length;
      pcVar3 = "|";
LAB_00216226:
      std::__cxx11::string::_M_replace((ulong)&this->colSeparator,0,pcVar4,(ulong)pcVar3);
      goto LAB_00216233;
    }
    if ((cVar1 == 'h') && (iVar2 = strncmp(mode_str,"html",__n), iVar2 == 0)) {
      this->mode = HTML;
      goto LAB_00216255;
    }
    if ((cVar1 == 't') && (iVar2 = strncmp(mode_str,"tcl",__n), iVar2 == 0)) {
      this->mode = TCL;
      pcVar4 = (char *)(this->colSeparator)._M_string_length;
      pcVar3 = " ";
      goto LAB_00216226;
    }
    if ((cVar1 == 'c') && (iVar2 = strncmp(mode_str,"csv",__n), iVar2 == 0)) {
      this->mode = CSV;
      std::__cxx11::string::_M_replace
                ((ulong)&this->colSeparator,0,(char *)(this->colSeparator)._M_string_length,
                 0x14a85a6);
      psVar5 = &this->rowSeparator;
      pcVar4 = (char *)(this->rowSeparator)._M_string_length;
      pcVar3 = "\r\n";
    }
    else {
      if ((cVar1 != 't') || (iVar2 = strncmp(mode_str,"tabs",__n), iVar2 != 0)) {
        switch((cVar1 + 0x9fU) * '@' | (byte)(cVar1 + 0x9fU) >> 2) {
        case 0:
switchD_002161a8_caseD_0:
          iVar2 = strncmp(mode_str,"ascii",__n);
          if (iVar2 == 0) {
            this->mode = ASCII;
            std::__cxx11::string::_M_replace
                      ((ulong)&this->colSeparator,0,(char *)(this->colSeparator)._M_string_length,
                       0x12d4e20);
            psVar5 = &this->rowSeparator;
            pcVar4 = (char *)(this->rowSeparator)._M_string_length;
            pcVar3 = "\x1e";
            goto LAB_0021624e;
          }
          if (cVar1 == 'm') goto switchD_002161a8_caseD_3;
          break;
        case 2:
          iVar2 = strncmp(mode_str,"insert",__n);
          if (iVar2 == 0) {
            this->mode = INSERT;
            pcVar4 = "table";
            if (tbl_name != (char *)0x0) {
              pcVar4 = tbl_name;
            }
            SetTableName(this,pcVar4);
            goto LAB_00216255;
          }
          if (cVar1 == 'a') goto switchD_002161a8_caseD_0;
          if (cVar1 == 'm') goto switchD_002161a8_caseD_3;
          if (cVar1 == 'q') goto switchD_002161a8_caseD_4;
          break;
        case 3:
switchD_002161a8_caseD_3:
          iVar2 = strncmp(mode_str,"markdown",__n);
          if (iVar2 == 0) {
            this->mode = MARKDOWN;
            goto LAB_00216255;
          }
          break;
        case 4:
switchD_002161a8_caseD_4:
          iVar2 = strncmp(mode_str,"quote",__n);
          if (iVar2 == 0) {
            this->mode = QUOTE;
            pcVar4 = (char *)(this->colSeparator)._M_string_length;
            pcVar3 = ",";
            goto LAB_00216226;
          }
          if (cVar1 == 'm') goto switchD_002161a8_caseD_3;
          if (cVar1 == 'a') goto switchD_002161a8_caseD_0;
        }
        if ((cVar1 == 't') && (iVar2 = strncmp(mode_str,"table",__n), iVar2 == 0)) {
          this->mode = TABLE;
        }
        else {
          if (cVar1 == 'd') {
            iVar2 = strncmp(mode_str,"duckbox",__n);
            if (iVar2 == 0) {
              this->mode = DUCKBOX;
              goto LAB_00216255;
            }
          }
          else if ((cVar1 == 'b') && (iVar2 = strncmp(mode_str,"box",__n), iVar2 == 0)) {
            this->mode = BOX;
            goto LAB_00216255;
          }
          if ((cVar1 == 'j') && (iVar2 = strncmp(mode_str,"json",__n), iVar2 == 0)) {
            this->mode = JSON;
          }
          else if ((cVar1 == 'l') && (iVar2 = strncmp(mode_str,"latex",__n), iVar2 == 0)) {
            this->mode = LATEX;
          }
          else if ((cVar1 == 't') && (iVar2 = strncmp(mode_str,"trash",__n), iVar2 == 0)) {
            this->mode = TRASH;
          }
          else {
            if ((cVar1 != 'j') || (iVar2 = strncmp(mode_str,"jsonlines",__n), iVar2 != 0)) {
              SetOutputMode();
              return false;
            }
            this->mode = JSONLINES;
          }
        }
        goto LAB_00216255;
      }
      this->mode = LIST;
      psVar5 = &this->colSeparator;
      pcVar4 = (char *)(this->colSeparator)._M_string_length;
      pcVar3 = anon_var_dwarf_6435659 + 7;
    }
  }
  else {
    this->mode = LINE;
LAB_00216233:
    psVar5 = &this->rowSeparator;
    pcVar4 = (char *)(this->rowSeparator)._M_string_length;
    pcVar3 = anon_var_dwarf_6435278 + 8;
  }
LAB_0021624e:
  std::__cxx11::string::_M_replace((ulong)psVar5,0,pcVar4,(ulong)pcVar3);
LAB_00216255:
  this->cMode = this->mode;
  return true;
}

Assistant:

bool ShellState::SetOutputMode(const char *mode_str, const char *tbl_name) {
	idx_t n2 = StringLength(mode_str);
	char c2 = mode_str[0];
	if (c2 == 'l' && n2 > 2 && strncmp(mode_str, "lines", n2) == 0) {
		mode = RenderMode::LINE;
		rowSeparator = SEP_Row;
	} else if (c2 == 'c' && strncmp(mode_str, "columns", n2) == 0) {
		mode = RenderMode::COLUMN;
		if ((shellFlgs & SHFLG_HeaderSet) == 0) {
			showHeader = true;
		}
		rowSeparator = SEP_Row;
	} else if (c2 == 'l' && n2 > 2 && strncmp(mode_str, "list", n2) == 0) {
		mode = RenderMode::LIST;
		colSeparator = SEP_Column;
		rowSeparator = SEP_Row;
	} else if (c2 == 'h' && strncmp(mode_str, "html", n2) == 0) {
		mode = RenderMode::HTML;
	} else if (c2 == 't' && strncmp(mode_str, "tcl", n2) == 0) {
		mode = RenderMode::TCL;
		colSeparator = SEP_Space;
		rowSeparator = SEP_Row;
	} else if (c2 == 'c' && strncmp(mode_str, "csv", n2) == 0) {
		mode = RenderMode::CSV;
		colSeparator = SEP_Comma;
		rowSeparator = SEP_CrLf;
	} else if (c2 == 't' && strncmp(mode_str, "tabs", n2) == 0) {
		mode = RenderMode::LIST;
		colSeparator = SEP_Tab;
	} else if (c2 == 'i' && strncmp(mode_str, "insert", n2) == 0) {
		mode = RenderMode::INSERT;
		SetTableName(tbl_name ? tbl_name : "table");
	} else if (c2 == 'q' && strncmp(mode_str, "quote", n2) == 0) {
		mode = RenderMode::QUOTE;
		colSeparator = SEP_Comma;
		rowSeparator = SEP_Row;
	} else if (c2 == 'a' && strncmp(mode_str, "ascii", n2) == 0) {
		mode = RenderMode::ASCII;
		colSeparator = SEP_Unit;
		rowSeparator = SEP_Record;
	} else if (c2 == 'm' && strncmp(mode_str, "markdown", n2) == 0) {
		mode = RenderMode::MARKDOWN;
	} else if (c2 == 't' && strncmp(mode_str, "table", n2) == 0) {
		mode = RenderMode::TABLE;
	} else if (c2 == 'b' && strncmp(mode_str, "box", n2) == 0) {
		mode = RenderMode::BOX;
	} else if (c2 == 'd' && strncmp(mode_str, "duckbox", n2) == 0) {
		mode = RenderMode::DUCKBOX;
	} else if (c2 == 'j' && strncmp(mode_str, "json", n2) == 0) {
		mode = RenderMode::JSON;
	} else if (c2 == 'l' && strncmp(mode_str, "latex", n2) == 0) {
		mode = RenderMode::LATEX;
	} else if (c2 == 't' && strncmp(mode_str, "trash", n2) == 0) {
		mode = RenderMode::TRASH;
	} else if (c2 == 'j' && strncmp(mode_str, "jsonlines", n2) == 0) {
		mode = RenderMode::JSONLINES;
	} else {
		raw_printf(stderr, "Error: mode should be one of: "
		                   "ascii box column csv duckbox html insert json jsonlines latex line "
		                   "list markdown quote table tabs tcl trash \n");
		return false;
	}
	cMode = mode;
	return true;
}